

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cpp
# Opt level: O3

int repair_main(int argc,char **argv)

{
  FILE *__stream;
  _Alloc_hider _Var1;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  string path;
  ZlibCompressor zlib;
  ZlibCompressorRaw zlib_raw;
  Options options;
  Status local_918;
  string local_910;
  string local_8f0;
  Compressor local_8d0;
  undefined1 local_8b0;
  Compressor local_8a8;
  undefined1 local_888;
  Options local_880;
  
  if ((argc < 3) || (iVar2 = strcmp("help",argv[1]), iVar2 == 0)) {
    printf("Usage: %s repair <minecraft_world_dir>\n",*argv);
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_880,argv[2],(allocator<char> *)&local_8a8);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_880);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_910.field_2._M_allocated_capacity = *psVar4;
    local_910.field_2._8_8_ = plVar3[3];
    local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
  }
  else {
    local_910.field_2._M_allocated_capacity = *psVar4;
    local_910._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_910._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_880.comparator != (Comparator *)&local_880.env) {
    operator_delete(local_880.comparator,(ulong)((long)&(local_880.env)->_vptr_Env + 1));
  }
  local_8a8.inputBytes = 0;
  local_8a8.compressedBytes = 0;
  local_8a8.uniqueCompressionID = '\x04';
  local_8a8._28_4_ = 0xffffffff;
  local_888 = 1;
  local_8a8._vptr_Compressor = (_func_int **)&PTR__Compressor_001310e0;
  local_8d0.inputBytes = 0;
  local_8d0.compressedBytes = 0;
  local_8d0.uniqueCompressionID = '\x02';
  local_8d0._28_4_ = 0xffffffff;
  local_8b0 = 0;
  local_8d0._vptr_Compressor = (_func_int **)&PTR__Compressor_00131110;
  leveldb::Options::Options(&local_880);
  local_880.compressors[1] = &local_8d0;
  local_880.compressors[0] = &local_8a8;
  leveldb::RepairDB((leveldb *)&local_8f0,&local_910,&local_880);
  _Var1._M_p = local_910._M_dataplus._M_p;
  __stream = _stderr;
  local_918.state_ = local_8f0._M_dataplus._M_p;
  iVar2 = 0;
  if (local_8f0._M_dataplus._M_p != (char *)0x0) {
    leveldb::Status::ToString_abi_cxx11_(&local_8f0,&local_918);
    fprintf(__stream,"ERROR: Repairing \'%s\' failed --- %s\n",_Var1._M_p,local_8f0._M_dataplus._M_p
           );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
      operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
    }
    iVar2 = 1;
    if (local_918.state_ != (char *)0x0) {
      operator_delete__(local_918.state_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p == &local_910.field_2) {
    return iVar2;
  }
  operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
  return iVar2;
}

Assistant:

int repair_main(int argc, char *argv[]) {
    if(argc < 3 || strcmp("help", argv[1]) == 0) {
        printf("Usage: %s repair <minecraft_world_dir>\n", argv[0]);
        return EXIT_FAILURE;
    }

    // construct path for Minecraft BE database
    std::string path = std::string(argv[2]) + "/db";

    leveldb::ZlibCompressorRaw zlib_raw;
    leveldb::ZlibCompressor zlib;

    leveldb::Options options;
    options.compressors[0] = &zlib_raw;
    options.compressors[1] = &zlib;

    leveldb::Status status;
    status = leveldb::RepairDB(path, options);

    if(!status.ok()) {
        fprintf(stderr, "ERROR: Repairing '%s' failed --- %s\n", path.c_str(),
                status.ToString().c_str());
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;
}